

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_gf(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  uint uVar3;
  byte *pbVar4;
  char *pcVar5;
  wchar_t idx;
  prefs_data *d;
  size_t i;
  char *t;
  char *s;
  wchar_t motion;
  char *direction;
  _Bool types [56];
  parser *p_local;
  
  memset(&direction,0,0x38);
  pbVar4 = (byte *)parser_priv(p);
  if (pbVar4 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x35e,"enum parser_error parse_prefs_gf(struct parser *)");
  }
  if ((*pbVar4 & 1) == 0) {
    pcVar5 = parser_getsym(p,"type");
    pcVar5 = string_make(pcVar5);
    i = (size_t)strtok(pcVar5,"| ");
    while (i != 0) {
      iVar1 = strcmp((char *)i,"*");
      if (iVar1 == 0) {
        memset(&direction,1,0x38);
      }
      else {
        wVar2 = proj_name_to_idx((char *)i);
        if (wVar2 == L'\xffffffff') {
          return PARSE_ERROR_INVALID_VALUE;
        }
        types[(long)wVar2 + -8] = true;
      }
      i = (size_t)strtok((char *)0x0,"| ");
    }
    string_free(pcVar5);
    pcVar5 = parser_getsym(p,"direction");
    iVar1 = strcmp(pcVar5,"static");
    if (iVar1 == 0) {
      s._4_4_ = 0;
    }
    else {
      iVar1 = strcmp(pcVar5,"0");
      if (iVar1 == 0) {
        s._4_4_ = 1;
      }
      else {
        iVar1 = strcmp(pcVar5,"45");
        if (iVar1 == 0) {
          s._4_4_ = 2;
        }
        else {
          iVar1 = strcmp(pcVar5,"90");
          if (iVar1 == 0) {
            s._4_4_ = 3;
          }
          else {
            iVar1 = strcmp(pcVar5,"135");
            if (iVar1 != 0) {
              return PARSE_ERROR_INVALID_VALUE;
            }
            s._4_4_ = 4;
          }
        }
      }
    }
    for (d = (prefs_data *)0x0; d < (prefs_data *)0x38; d = (prefs_data *)&d->field_0x1) {
      if ((*(byte *)((long)&direction + (long)d) & 1) != 0) {
        uVar3 = parser_getuint(p,"attr");
        proj_to_attr[(long)d][s._4_4_] = (uint8_t)uVar3;
        wVar2 = parser_getuint(p,"char");
        proj_to_char[(long)d][s._4_4_] = wVar2;
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_gf(struct parser *p)
{
	bool types[PROJ_MAX] = { 0 };
	const char *direction;
	int motion;

	char *s, *t;

	size_t i;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	/* Parse the type, which is a | separated list of PROJ_ constants */
	s = string_make(parser_getsym(p, "type"));
	t = strtok(s, "| ");
	while (t) {
		if (streq(t, "*")) {
			memset(types, true, sizeof types);
		} else {
			int idx = proj_name_to_idx(t);
			if (idx == -1)
				return PARSE_ERROR_INVALID_VALUE;

			types[idx] = true;
		}

		t = strtok(NULL, "| ");
	}

	string_free(s);

	direction = parser_getsym(p, "direction");
	if (streq(direction, "static"))
		motion = BOLT_NO_MOTION;
	else if (streq(direction, "0"))
		motion = BOLT_0;
	else if (streq(direction, "45"))
		motion = BOLT_45;
	else if (streq(direction, "90"))
		motion = BOLT_90;
	else if (streq(direction, "135"))
		motion = BOLT_135;
	else
		return PARSE_ERROR_INVALID_VALUE;

	for (i = 0; i < PROJ_MAX; i++) {
		if (!types[i]) continue;

		proj_to_attr[i][motion] = (uint8_t)parser_getuint(p, "attr");
		proj_to_char[i][motion] = (wchar_t)parser_getuint(p, "char");
	}

	return PARSE_ERROR_NONE;
}